

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative-simple.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  llama_token lVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  common_log *pcVar7;
  undefined8 uVar8;
  long lVar9;
  common_sampler *gsmpl;
  common_speculative *spec;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  pointer piVar15;
  ulong uVar16;
  pointer piVar17;
  ulong uVar18;
  bool bVar19;
  float fVar20;
  common_speculative_params params_00;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_1545;
  llama_token id_last;
  _Head_base<0UL,_llama_model_*,_false> local_1540;
  vector<int,_std::allocator<int>_> inp;
  long local_1510;
  vector<int,_std::allocator<int>_> ids;
  long local_14f0;
  long local_14e8;
  llama_tokens draft;
  llama_batch batch_tgt;
  llama_tokens prompt_tgt;
  string token_str;
  common_init_result llama_init_tgt;
  common_init_result llama_init_dft;
  undefined1 local_13b0 [56];
  common_params params;
  
  common_params::common_params(&params);
  iVar5 = 1;
  bVar2 = common_params_parse(argc,argv,&params,LLAMA_EXAMPLE_SPECULATIVE,
                              (_func_void_int_char_ptr_ptr *)0x0);
  if (!bVar2) goto LAB_0013067f;
  if (params.n_predict < -1) {
    if (common_log_verbosity_thold < 0) goto LAB_0013067f;
    pcVar7 = common_log_main();
    pcVar14 = "%s: --n-predict must be >= -1\n";
  }
  else {
    common_init();
    if (params.speculative.model.path._M_string_length != 0) {
      llama_backend_init();
      llama_numa_init(params.numa);
      common_init_from_params(&llama_init_tgt,&params);
      uVar8 = llama_model_get_vocab
                        (llama_init_tgt.model._M_t.
                         super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                         super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                         super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
      std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::operator=
                (&params.devices,&params.speculative.devices);
      common_params_model::operator=(&params.model,&params.speculative.model);
      params.n_ctx = params.speculative.n_ctx;
      params.n_gpu_layers = params.speculative.n_gpu_layers;
      if (0 < params.speculative.cpuparams.n_threads) {
        params.cpuparams.n_threads = params.speculative.cpuparams.n_threads;
      }
      params.cpuparams_batch.n_threads = params.speculative.cpuparams_batch.n_threads;
      common_init_from_params(&llama_init_dft,&params);
      bVar2 = common_speculative_are_compatible
                        ((llama_context *)
                         llama_init_tgt.context._M_t.
                         super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                         super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,
                         (llama_context *)
                         llama_init_dft.context._M_t.
                         super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                         super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
      if (bVar2) {
        inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)0x0;
        inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        iVar5 = 1;
        common_tokenize((vector<int,_std::allocator<int>_> *)&batch_tgt,
                        (llama_context *)
                        llama_init_tgt.context._M_t.
                        super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                        super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,&params.prompt,
                        true,true);
        std::vector<int,_std::allocator<int>_>::_M_move_assign(&inp);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&batch_tgt);
        uVar4 = llama_n_ctx(llama_init_tgt.context._M_t.
                            super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                            super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
        if (uVar4 < (uint)((ulong)((long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2)) {
          if (-1 < common_log_verbosity_thold) {
            pcVar7 = common_log_main();
            piVar17 = inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            piVar15 = inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar4 = llama_n_ctx(llama_init_tgt.context._M_t.
                                super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                                super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
            pcVar14 = "%s: the prompt exceeds the context size (%d tokens, ctx %d)\n";
LAB_0012fd38:
            common_log_add(pcVar7,GGML_LOG_LEVEL_ERROR,pcVar14,"main",
                           (ulong)((long)piVar17 - (long)piVar15) >> 2 & 0xffffffff,(ulong)uVar4);
          }
        }
        else {
          uVar4 = llama_n_batch(llama_init_tgt.context._M_t.
                                super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                                super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
          local_1540._M_head_impl =
               (llama_model *)
               llama_init_tgt.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>.
               _M_t.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
               super__Head_base<0UL,_llama_model_*,_false>._M_head_impl;
          if (uVar4 < (uint)((ulong)((long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                           .super__Vector_impl_data._M_finish -
                                    (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2)) {
            if (-1 < common_log_verbosity_thold) {
              pcVar7 = common_log_main();
              piVar17 = inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              piVar15 = inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar4 = llama_n_batch(llama_init_tgt.context._M_t.
                                    super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t
                                    .super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                                    super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
              pcVar14 = "%s: the prompt exceeds the batch size (%d tokens, batch %d)\n";
              goto LAB_0012fd38;
            }
          }
          else {
            if (-1 < common_log_verbosity_thold) {
              pcVar7 = common_log_main();
              common_log_add(pcVar7,GGML_LOG_LEVEL_NONE,"\n\n");
            }
            piVar15 = inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (piVar17 = inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start; piVar17 != piVar15;
                piVar17 = piVar17 + 1) {
              if (-1 < common_log_verbosity_thold) {
                lVar1 = *piVar17;
                pcVar7 = common_log_main();
                common_token_to_piece_abi_cxx11_
                          ((string *)&batch_tgt,
                           (llama_context *)
                           llama_init_tgt.context._M_t.
                           super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                           super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,lVar1,true);
                common_log_add(pcVar7,GGML_LOG_LEVEL_NONE,"%s",
                               CONCAT44(batch_tgt._4_4_,batch_tgt.n_tokens));
                std::__cxx11::string::~string((string *)&batch_tgt);
              }
            }
            lVar9 = ggml_time_us();
            gsmpl = common_sampler_init(local_1540._M_head_impl,&params.sampling);
            llama_batch_get_one(local_13b0,
                                inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (int)((ulong)((long)inp.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                             (long)inp.super__Vector_base<int,_std::allocator<int>_>
                                                   ._M_impl.super__Vector_impl_data._M_start) >> 2)
                                + -1);
            llama_decode(llama_init_tgt.context._M_t.
                         super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                         super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
            id_last = inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1];
            std::vector<int,std::allocator<int>>::
            vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                      ((vector<int,std::allocator<int>> *)&prompt_tgt,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + -1),(allocator_type *)&batch_tgt);
            uVar4 = llama_n_ctx(llama_init_tgt.context._M_t.
                                super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                                super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
            std::vector<int,_std::allocator<int>_>::reserve(&prompt_tgt,(ulong)uVar4);
            uVar16 = (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
            iVar5 = llama_n_ctx(llama_init_dft.context._M_t.
                                super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                                super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                                super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
            spec = common_speculative_init
                             ((llama_context *)
                              llama_init_dft.context._M_t.
                              super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                              super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
            uVar6 = llama_n_batch(llama_init_tgt.context._M_t.
                                  super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                                  super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                                  super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
            llama_batch_init(&batch_tgt,uVar6,0,1);
            lVar10 = ggml_time_us();
            lVar11 = ggml_time_us();
            local_1540._M_head_impl = (llama_model *)(ulong)((int)(uVar16 >> 2) - 1);
            params_00.n_reuse = iVar5 - params.speculative.n_max;
            params_00.n_draft = params.speculative.n_max;
            local_14f0 = 0;
            local_14e8 = 0;
            local_1510 = 0;
            do {
              params_00.p_min = params.speculative.p_min;
              common_speculative_gen_draft(&draft,spec,params_00,&prompt_tgt,id_last);
              common_batch_clear(&batch_tgt);
              lVar1 = id_last;
              ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start._0_4_ = 0;
              __l._M_len = 1;
              __l._M_array = (iterator)&ids;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&token_str,__l,&local_1545);
              common_batch_add(&batch_tgt,lVar1,(llama_pos)local_1540._M_head_impl,
                               (vector<int,_std::allocator<int>_> *)&token_str,true);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        ((_Vector_base<int,_std::allocator<int>_> *)&token_str);
              if (((long)draft.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)draft.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start != 0) &&
                 ((ulong)((long)draft.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)draft.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2) <
                  (ulong)(long)params.speculative.n_min)) {
                draft.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = draft.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
              }
              iVar5 = (int)local_1540._M_head_impl;
              for (uVar16 = 0;
                  uVar16 < (ulong)((long)draft.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                   (long)draft.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_start >> 2);
                  uVar16 = uVar16 + 1) {
                lVar1 = draft.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16];
                ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start._0_4_ = 0;
                __l_00._M_len = 1;
                __l_00._M_array = (iterator)&ids;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&token_str,__l_00,&local_1545);
                common_batch_add(&batch_tgt,lVar1,iVar5 + 1 + (int)uVar16,
                                 (vector<int,_std::allocator<int>_> *)&token_str,true);
                std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                          ((_Vector_base<int,_std::allocator<int>_> *)&token_str);
              }
              llama_decode(llama_init_tgt.context._M_t.
                           super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                           super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
              common_sampler_sample_and_accept_n
                        (&ids,gsmpl,
                         (llama_context *)
                         llama_init_tgt.context._M_t.
                         super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                         super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,&draft,false);
              lVar12 = CONCAT44(ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
              if ((long)ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - lVar12 == 0) {
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/speculative-simple/speculative-simple.cpp"
                           ,0xb8,"GGML_ASSERT(%s) failed","ids.size() > 0");
              }
              lVar13 = (long)ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - lVar12 >> 2;
              local_1540._M_head_impl =
                   (llama_model *)(ulong)(uint)((int)local_1540._M_head_impl + (int)lVar13);
              local_14e8 = (long)(int)local_14e8 +
                           ((long)draft.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)draft.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2);
              local_14f0 = (int)local_14f0 + lVar13 + -1;
              local_1510 = (int)local_1510 + lVar13;
              for (uVar16 = 0;
                  uVar18 = (long)ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - lVar12 >> 2, uVar16 < uVar18;
                  uVar16 = uVar16 + 1) {
                std::vector<int,_std::allocator<int>_>::push_back(&prompt_tgt,&id_last);
                id_last = *(llama_token *)
                           (CONCAT44(ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) + uVar16 * 4);
                cVar3 = llama_vocab_is_eog(uVar8);
                if (cVar3 != '\0') break;
                common_token_to_piece_abi_cxx11_
                          (&token_str,
                           (llama_context *)
                           llama_init_tgt.context._M_t.
                           super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                           super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,id_last,true);
                if ((params.use_color == true) &&
                   (uVar16 + 1 <
                    (ulong)((long)ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            CONCAT44(ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_) >> 2))) {
                  if (-1 < common_log_verbosity_thold) {
                    pcVar7 = common_log_main();
                    common_log_add(pcVar7,GGML_LOG_LEVEL_NONE,"\x1b[%dm%s\x1b[37m",0x24,
                                   token_str._M_dataplus._M_p);
                  }
                }
                else if (-1 < common_log_verbosity_thold) {
                  pcVar7 = common_log_main();
                  common_log_add(pcVar7,GGML_LOG_LEVEL_NONE,"%s",token_str._M_dataplus._M_p);
                }
                std::__cxx11::string::~string((string *)&token_str);
                lVar12 = CONCAT44(ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_);
              }
              if (0 < common_log_verbosity_thold) {
                pcVar7 = common_log_main();
                common_log_add(pcVar7,GGML_LOG_LEVEL_DEBUG,
                               "accepted %d/%d draft tokens, the last target token is: (%d)\n",
                               (ulong)((int)((ulong)((long)ids.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  CONCAT44(ids.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  ids.super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_))
                                            >> 2) - 1),
                               (ulong)((long)draft.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)draft.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 2,
                               (ulong)(uint)id_last);
                if (0 < common_log_verbosity_thold) {
                  pcVar7 = common_log_main();
                  common_log_add(pcVar7,GGML_LOG_LEVEL_DEBUG,
                                 "clear kv cache from any extra tokens, n_past = %d\n",
                                 local_1540._M_head_impl);
                }
              }
              llama_kv_self_seq_rm
                        (llama_init_tgt.context._M_t.
                         super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                         super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,0,
                         local_1540._M_head_impl,0xffffffffffffffff);
              bVar19 = params.n_predict < 0;
              bVar2 = (int)local_1510 <= params.n_predict;
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&ids.super__Vector_base<int,_std::allocator<int>_>);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&draft.super__Vector_base<int,_std::allocator<int>_>);
            } while ((bVar19 || bVar2) && (uVar18 <= uVar16));
            lVar12 = ggml_time_us();
            if (-1 < common_log_verbosity_thold) {
              uVar16 = (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              pcVar7 = common_log_main();
              common_log_add(pcVar7,GGML_LOG_LEVEL_NONE,"\n\n");
              if (-1 < common_log_verbosity_thold) {
                pcVar7 = common_log_main();
                fVar20 = (float)(lVar10 - lVar9) / 1e+06;
                common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,
                               "encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n",
                               SUB84((double)fVar20,0),
                               SUB84((double)((float)(ulong)((long)inp.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)inp.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start >> 2) /
                                             fVar20),0),uVar16 >> 2 & 0xffffffff);
                if (-1 < common_log_verbosity_thold) {
                  pcVar7 = common_log_main();
                  fVar20 = (float)(lVar12 - lVar11) / 1e+06;
                  common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,
                                 "decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n",
                                 SUB84((double)fVar20,0),
                                 SUB84((double)((float)(int)local_1510 / fVar20),0));
                  if (-1 < common_log_verbosity_thold) {
                    pcVar7 = common_log_main();
                    common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"\n");
                    if (-1 < common_log_verbosity_thold) {
                      pcVar7 = common_log_main();
                      common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"n_draft   = %d\n",
                                     (ulong)(uint)params.speculative.n_max);
                      if (-1 < common_log_verbosity_thold) {
                        pcVar7 = common_log_main();
                        common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"n_predict = %d\n",local_1510);
                        if (-1 < common_log_verbosity_thold) {
                          pcVar7 = common_log_main();
                          common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"n_drafted = %d\n",local_14e8);
                          if (-1 < common_log_verbosity_thold) {
                            pcVar7 = common_log_main();
                            common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"n_accept  = %d\n",local_14f0)
                            ;
                            if (-1 < common_log_verbosity_thold) {
                              pcVar7 = common_log_main();
                              common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"accept    = %.3f%%\n",
                                             SUB84((double)(((float)(int)local_14f0 * 100.0) /
                                                           (float)(int)local_14e8),0));
                              if (-1 < common_log_verbosity_thold) {
                                pcVar7 = common_log_main();
                                common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"\n");
                                if (-1 < common_log_verbosity_thold) {
                                  pcVar7 = common_log_main();
                                  common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"draft:\n\n");
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            llama_perf_context_print
                      (llama_init_dft.context._M_t.
                       super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                       super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                       super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
            if (-1 < common_log_verbosity_thold) {
              pcVar7 = common_log_main();
              common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"\n");
              if (-1 < common_log_verbosity_thold) {
                pcVar7 = common_log_main();
                common_log_add(pcVar7,GGML_LOG_LEVEL_INFO,"target:\n\n");
              }
            }
            common_perf_print((llama_context *)
                              llama_init_tgt.context._M_t.
                              super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                              super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                              super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,gsmpl);
            common_sampler_free(gsmpl);
            common_speculative_free(spec);
            llama_backend_free();
            if (-1 < common_log_verbosity_thold) {
              pcVar7 = common_log_main();
              common_log_add(pcVar7,GGML_LOG_LEVEL_NONE,"\n\n");
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&prompt_tgt.super__Vector_base<int,_std::allocator<int>_>);
            iVar5 = 0;
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&inp.super__Vector_base<int,_std::allocator<int>_>);
      }
      else {
        iVar5 = 1;
      }
      common_init_result::~common_init_result(&llama_init_dft);
      common_init_result::~common_init_result(&llama_init_tgt);
      goto LAB_0013067f;
    }
    if (common_log_verbosity_thold < 0) goto LAB_0013067f;
    pcVar7 = common_log_main();
    pcVar14 = "%s: --model-draft is required\n";
  }
  common_log_add(pcVar7,GGML_LOG_LEVEL_ERROR,pcVar14,"main");
LAB_0013067f:
  common_params::~common_params(&params);
  return iVar5;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_SPECULATIVE)) {
        return 1;
    }

    if (params.n_predict < -1) {
        LOG_ERR("%s: --n-predict must be >= -1\n", __func__);
        return 1;
    }

    common_init();

    if (params.speculative.model.path.empty()) {
        LOG_ERR("%s: --model-draft is required\n", __func__);
        return 1;
    }

    // init llama.cpp
    llama_backend_init();
    llama_numa_init(params.numa);

    llama_model * model_tgt = NULL;
    //llama_model * model_dft = NULL;

    llama_context * ctx_tgt = NULL;
    llama_context * ctx_dft = NULL;

    // load the target model
    common_init_result llama_init_tgt = common_init_from_params(params);

    model_tgt = llama_init_tgt.model.get();
    ctx_tgt   = llama_init_tgt.context.get();

    const llama_vocab * vocab = llama_model_get_vocab(model_tgt);

    // load the draft model
    params.devices      = params.speculative.devices;
    params.model        = params.speculative.model;
    params.n_ctx        = params.speculative.n_ctx;
    params.n_batch      = params.speculative.n_ctx > 0 ? params.speculative.n_ctx : params.n_batch;
    params.n_gpu_layers = params.speculative.n_gpu_layers;

    if (params.speculative.cpuparams.n_threads > 0) {
        params.cpuparams.n_threads = params.speculative.cpuparams.n_threads;
    }

    params.cpuparams_batch.n_threads = params.speculative.cpuparams_batch.n_threads;
    common_init_result llama_init_dft = common_init_from_params(params);

    //model_dft = llama_init_dft.model.get();
    ctx_dft   = llama_init_dft.context.get();

    if (!common_speculative_are_compatible(ctx_tgt, ctx_dft)) {
        return 1;
    }

    // Tokenize the prompt
    std::vector<llama_token> inp;
    inp = common_tokenize(ctx_tgt, params.prompt, true, true);

    if (llama_n_ctx(ctx_tgt) < (uint32_t) inp.size()) {
        LOG_ERR("%s: the prompt exceeds the context size (%d tokens, ctx %d)\n", __func__, (int) inp.size(), llama_n_ctx(ctx_tgt));

        return 1;
    }

    if (llama_n_batch(ctx_tgt) < (uint32_t) inp.size()) {
        LOG_ERR("%s: the prompt exceeds the batch size (%d tokens, batch %d)\n", __func__, (int) inp.size(), llama_n_batch(ctx_tgt));

        return 1;
    }

    LOG("\n\n");

    for (auto id : inp) {
        LOG("%s", common_token_to_piece(ctx_tgt, id).c_str());
    }

    // how many tokens to draft each time
    int n_draft     = params.speculative.n_max;
    int n_draft_min = params.speculative.n_min;

    float p_min = params.speculative.p_min;

    int n_predict = 0;
    int n_drafted = 0;
    int n_accept  = 0;

    // used to determine end of generation
    bool has_eos = false;

    // ================================================
    // everything until here is standard initialization
    // the relevant stuff for speculative decoding starts here

    const auto t_enc_start = ggml_time_us();

    // target model sampling context
    struct common_sampler * smpl = common_sampler_init(model_tgt, params.sampling);

    // eval the prompt
    llama_decode(ctx_tgt, llama_batch_get_one(inp.data(), inp.size() - 1));

    // note: keep the last token separate!
    llama_token id_last = inp.back();

    // all tokens currently in the target context
    llama_tokens prompt_tgt(inp.begin(), inp.end() - 1);
    prompt_tgt.reserve(llama_n_ctx(ctx_tgt));

    int n_past = inp.size() - 1;

    // init the speculator
    struct common_speculative_params params_spec;
    params_spec.n_draft = n_draft;
    params_spec.n_reuse = llama_n_ctx(ctx_dft) - n_draft;
    params_spec.p_min   = p_min;

    struct common_speculative * spec = common_speculative_init(ctx_dft);

    llama_batch batch_tgt = llama_batch_init(llama_n_batch(ctx_tgt), 0, 1);

    const auto t_enc_end = ggml_time_us();

    const auto t_dec_start = ggml_time_us();

    while (true) {
        // optionally, generate draft tokens that can be appended to the target batch
        //
        // this is the most important part of the speculation. the more probable tokens that are provided here
        // the better the performance will be. in theory, this computation can be performed asynchronously and even
        // offloaded to a remote device. it doesn't even have to be based on an LLM. instead, it can provide tokens
        // from a cache or lookup tables.
        //
        llama_tokens draft = common_speculative_gen_draft(spec, params_spec, prompt_tgt, id_last);

        //LOG_DBG("draft: %s\n", string_from(ctx_dft, draft).c_str());

        // always have a token to evaluate from before - id_last
        common_batch_clear(batch_tgt);
        common_batch_add  (batch_tgt, id_last, n_past++, { 0 }, true);

        // evaluate the target model on [id_last, draft0, draft1, ..., draftN-1]
        {
            // do not waste time on small drafts
            if (draft.size() < (size_t) n_draft_min) {
                draft.clear();
            }

            for (size_t i = 0; i < draft.size(); ++i) {
                common_batch_add(batch_tgt, draft[i], n_past + i, { 0 }, true);
            }

            //LOG_DBG("target batch: %s\n", string_from(ctx_tgt, batch_tgt).c_str());

            llama_decode(ctx_tgt, batch_tgt);
        }

        // sample from the full target batch and return the accepted tokens based on the target sampler
        //
        // for each token to be accepted, the sampler would have to sample that same token
        // in such cases, instead of decoding the sampled token as we normally do, we simply continue with the
        // available logits from the batch and sample the next token until we run out of logits or the sampler
        // disagrees with the draft
        //
        const auto ids = common_sampler_sample_and_accept_n(smpl, ctx_tgt, draft);

        //LOG_DBG("ids: %s\n", string_from(ctx_tgt, ids).c_str());

        GGML_ASSERT(ids.size() > 0); // there will always be at least one accepted token

        n_past    += ids.size() - 1;
        n_drafted += draft.size(); // note: we ignore the discarded small drafts
        n_accept  += ids.size() - 1;
        n_predict += ids.size();

        // process the accepted tokens and update contexts
        //
        // this is the standard token post-processing that we normally do
        // in this case, we do it for a group of accepted tokens at once
        //
        for (size_t i = 0; i < ids.size(); ++i) {
            prompt_tgt.push_back(id_last);

            id_last = ids[i];

            if (llama_vocab_is_eog(vocab, id_last)) {
                has_eos = true;
                break;
            }

            const std::string token_str = common_token_to_piece(ctx_tgt, id_last);

            if (params.use_color && i + 1 < ids.size()) {
                LOG("\u001b[%dm%s\u001b[37m", (36 - 0 % 6), token_str.c_str());
            } else {
                LOG("%s", token_str.c_str());
            }
        }

        LOG_DBG("accepted %d/%d draft tokens, the last target token is: (%d)\n", (int) ids.size() - 1, (int) draft.size(), id_last);

        {
            LOG_DBG("clear kv cache from any extra tokens, n_past = %d\n", n_past);

            llama_kv_self_seq_rm(ctx_tgt, 0, n_past, -1);
        }

        if ((params.n_predict >= 0 && n_predict > params.n_predict) || has_eos) {
            break;
        }
    }

    auto t_dec_end = ggml_time_us();

    const int n_input = inp.size();

    LOG("\n\n");

    LOG_INF("encoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_input,   (t_enc_end - t_enc_start) / 1e6f, inp.size() / ((t_enc_end - t_enc_start) / 1e6f));
    LOG_INF("decoded %4d tokens in %8.3f seconds, speed: %8.3f t/s\n", n_predict, (t_dec_end - t_dec_start) / 1e6f, n_predict  / ((t_dec_end - t_dec_start) / 1e6f));

    LOG_INF("\n");
    LOG_INF("n_draft   = %d\n", n_draft);
    LOG_INF("n_predict = %d\n", n_predict);
    LOG_INF("n_drafted = %d\n", n_drafted);
    LOG_INF("n_accept  = %d\n", n_accept);
    LOG_INF("accept    = %.3f%%\n", 100.0f * n_accept / n_drafted);

    LOG_INF("\n");
    LOG_INF("draft:\n\n");

    llama_perf_context_print(ctx_dft);

    LOG_INF("\n");
    LOG_INF("target:\n\n");
    common_perf_print(ctx_tgt, smpl);

    common_sampler_free(smpl);
    common_speculative_free(spec);

    llama_backend_free();

    LOG("\n\n");

    return 0;
}